

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void snap_restoredata(GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref,void *dst,
                     CTSize sz)

{
  char *pcVar1;
  IRIns *pIVar2;
  IRIns *pIVar3;
  uint uVar4;
  ulong uVar5;
  IRIns local_20;
  
  pIVar3 = T->ir;
  uVar5 = (ulong)ref;
  pIVar2 = pIVar3 + uVar5;
  if (ref < 0x8000) {
    if ((byte)((pIVar2->field_1).o - 0x1b) < 2) {
      pIVar3 = (IRIns *)(ulong)(pIVar2->field_1).op12;
    }
    else {
      pIVar3 = pIVar2;
      if (sz == 8) {
        uVar4 = (pIVar2->field_1).op12;
LAB_00140eec:
        local_20._4_4_ = 0;
        local_20.field_1.op12 = uVar4;
        pIVar3 = &local_20;
        goto LAB_00140f2b;
      }
    }
  }
  else {
    uVar4 = (uint)*(ushort *)((long)pIVar3 + uVar5 * 8 + 6);
    if (((rfilt >> (uVar5 & 0x3f) & 1) != 0) &&
       (uVar5 = (ulong)(T->nins - 1), *(char *)((long)pIVar3 + uVar5 * 8 + 5) == '\x14')) {
      pIVar3 = pIVar3 + uVar5;
      do {
        if (((pIVar3->field_0).op1 == ref) && ((pIVar3->field_0).op2 <= snapno)) {
          uVar4 = (uint)(pIVar3->field_0).prev;
        }
        pcVar1 = (char *)((long)pIVar3 + -3);
        pIVar3 = pIVar3 + -1;
      } while (*pcVar1 == '\x14');
    }
    if (uVar4 < 0x100) {
      if (0x7f < uVar4) {
        snap_restoredata(T,ex,snapno,rfilt,(uint)(pIVar2->field_0).op1,dst,4);
        *(double *)dst = (double)*dst;
        return;
      }
      pIVar3 = (IRIns *)(ex->fpr + (uVar4 - 0x10));
      if (uVar4 < 0x10) {
        pIVar3 = (IRIns *)(ex->gpr + uVar4);
      }
    }
    else {
      pIVar3 = (IRIns *)(ex->spill + (uVar4 >> 8));
      if (sz == 8) {
        uVar4._0_2_ = *(IROpT *)((long)pIVar2 + 4);
        uVar4._2_2_ = *(IRRef1 *)((long)pIVar2 + 6);
        if ((0x604208U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_00140f2b;
        uVar4 = (pIVar3->field_1).op12;
        goto LAB_00140eec;
      }
    }
  }
  if (sz == 1) {
    *(undefined1 *)dst = *(undefined1 *)pIVar3;
    return;
  }
  if (sz != 8) {
    if (sz == 4) {
      *(IRRef2 *)dst = (pIVar3->field_1).op12;
      return;
    }
    *(IRRef1 *)dst = (pIVar3->field_0).op1;
    return;
  }
LAB_00140f2b:
  *(anon_struct_8_4_c535eab0_for_IRIns_0 *)dst = *(anon_struct_8_4_c535eab0_for_IRIns_0 *)pIVar3;
  return;
}

Assistant:

static void snap_restoredata(GCtrace *T, ExitState *ex,
			     SnapNo snapno, BloomFilter rfilt,
			     IRRef ref, void *dst, CTSize sz)
{
  IRIns *ir = &T->ir[ref];
  RegSP rs = ir->prev;
  int32_t *src;
  uint64_t tmp;
  if (irref_isk(ref)) {
    if (ir->o == IR_KNUM || ir->o == IR_KINT64) {
      src = mref(ir->ptr, int32_t);
    } else if (sz == 8) {
      tmp = (uint64_t)(uint32_t)ir->i;
      src = (int32_t *)&tmp;
    } else {
      src = &ir->i;
    }
  } else {
    if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
      rs = snap_renameref(T, snapno, ref, rs);
    if (ra_hasspill(regsp_spill(rs))) {
      src = &ex->spill[regsp_spill(rs)];
      if (sz == 8 && !irt_is64(ir->t)) {
	tmp = (uint64_t)(uint32_t)*src;
	src = (int32_t *)&tmp;
      }
    } else {
      Reg r = regsp_reg(rs);
      if (ra_noreg(r)) {
	/* Note: this assumes CNEWI is never used for SOFTFP split numbers. */
	lua_assert(sz == 8 && ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT);
	snap_restoredata(T, ex, snapno, rfilt, ir->op1, dst, 4);
	*(lua_Number *)dst = (lua_Number)*(int32_t *)dst;
	return;
      }
      src = (int32_t *)&ex->gpr[r-RID_MIN_GPR];
#if !LJ_SOFTFP
      if (r >= RID_MAX_GPR) {
	src = (int32_t *)&ex->fpr[r-RID_MIN_FPR];
#if LJ_TARGET_PPC
	if (sz == 4) {  /* PPC FPRs are always doubles. */
	  *(float *)dst = (float)*(double *)src;
	  return;
	}
#else
	if (LJ_BE && sz == 4) src++;
#endif
      }
#endif
    }
  }
  lua_assert(sz == 1 || sz == 2 || sz == 4 || sz == 8);
  if (sz == 4) *(int32_t *)dst = *src;
  else if (sz == 8) *(int64_t *)dst = *(int64_t *)src;
  else if (sz == 1) *(int8_t *)dst = (int8_t)*src;
  else *(int16_t *)dst = (int16_t)*src;
}